

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vulnerabilitytobin.cpp
# Opt level: O1

void __thiscall VulnerabilityToBin::ReadVulnerabilityFileNoChecks(VulnerabilityToBin *this)

{
  Validate *__s;
  uint in_EAX;
  int iVar1;
  char *pcVar2;
  OASIS_FLOAT totalProbability;
  undefined8 uStack_28;
  
  uStack_28 = (ulong)in_EAX;
  ValidateVulnerability::ReadFirstVulnerabilityLine
            (&this->super_ValidateVulnerability,(OASIS_FLOAT *)((long)&uStack_28 + 4));
  (**(this->super_ValidateVulnerability)._vptr_ValidateVulnerability)(this);
  __s = &(this->super_ValidateVulnerability).super_Validate;
  pcVar2 = fgets(__s->line_,0x1000,_stdin);
  while (pcVar2 != (char *)0x0) {
    iVar1 = ValidateVulnerability::ScanLine(&this->super_ValidateVulnerability);
    if (iVar1 == 4) {
      iVar1 = (int)(this->super_ValidateVulnerability).initialVulID_;
      (this->super_ValidateVulnerability).v_.vulnerability_id = iVar1;
      if (((this->super_ValidateVulnerability).useIndexFile_ == true) &&
         ((this->super_ValidateVulnerability).prevVulID_ != iVar1)) {
        (*(this->super_ValidateVulnerability)._vptr_ValidateVulnerability[1])(this);
        (this->super_ValidateVulnerability).prevVulID_ =
             (this->super_ValidateVulnerability).v_.vulnerability_id;
      }
      (**(this->super_ValidateVulnerability)._vptr_ValidateVulnerability)(this);
    }
    else {
      ReadVulnerabilityFileNoChecks();
    }
    pcVar2 = fgets(__s->line_,0x1000,_stdin);
  }
  if ((this->super_ValidateVulnerability).useIndexFile_ == true) {
    (*(this->super_ValidateVulnerability)._vptr_ValidateVulnerability[1])(this);
  }
  return;
}

Assistant:

void VulnerabilityToBin::ReadVulnerabilityFileNoChecks() {

  ReadFirstVulnerabilityLine();
  WriteBinVulnerabilityFile();

  while (fgets(line_, sizeof(line_), stdin) != 0) {

    if (ScanLine() == 4) {

      v_.vulnerability_id = int(initialVulID_);

      if (useIndexFile_) {

        if (v_.vulnerability_id != prevVulID_) {

          WriteIdxVulnerabilityFile();
	  prevVulID_ = v_.vulnerability_id;

        }

      }

      WriteBinVulnerabilityFile();
      continue;

    }

    fprintf(stderr, "ERROR: Invalid data in line %d:\n%s\n", lineno_, line_);
    PrintErrorMessage();

  }

  if (useIndexFile_) WriteIdxVulnerabilityFile();

}